

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdb.h
# Opt level: O1

uint cdb_append(cdb *p,uint size)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/cdb.h"
                  ,0x47,"unsigned int cdb_append(struct cdb *, unsigned int)");
  }
  uVar2 = p->size + size;
  uVar1 = p->cap;
  uVar4 = uVar1;
  if (uVar1 < uVar2) {
    while (uVar4 < uVar2) {
      uVar4 = uVar4 + ((uVar4 >> 3) + (uVar4 >> 1) & 0xfffffffe) + 2;
      p->cap = uVar4;
      if (uVar4 < uVar1) {
        __assert_fail("p->cap >= prev_cap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/cdb.h"
                      ,0x2f,"void cdb_grow(struct cdb *, unsigned int)");
      }
    }
    if (uVar4 == 0) {
      __assert_fail("p->cap > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/cdb.h"
                    ,0x31,"void cdb_grow(struct cdb *, unsigned int)");
    }
    puVar3 = (uint *)realloc(p->data,(ulong)uVar4 << 2);
    p->data = puVar3;
  }
  uVar1 = p->size;
  p->size = size + uVar1;
  if (size + uVar1 <= uVar1) {
    __assert_fail("p->size > prev_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/cdb.h"
                  ,0x4b,"unsigned int cdb_append(struct cdb *, unsigned int)");
  }
  return uVar1;
}

Assistant:

static inline unsigned cdb_append(struct cdb *p, unsigned size)
{
    unsigned prev_size;
    assert(size > 0);
    cdb_grow(p, p->size + size);
    prev_size = p->size;
    p->size += size;
    assert(p->size > prev_size);
    return prev_size;
}